

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

uint64_t pull_varint(uchar **cursor,size_t *max)

{
  uchar *puVar1;
  ulong __n;
  size_t sVar2;
  ulong __n_00;
  uchar buf [9];
  uint64_t v;
  uchar local_49;
  undefined1 local_48 [8];
  size_t *local_40;
  uint64_t local_38;
  
  sVar2 = *max;
  puVar1 = *cursor;
  if (sVar2 == 0) {
    memcpy(&local_49,puVar1,0);
    sVar2 = 0;
    memset(&local_49,0,1);
    *cursor = (uchar *)0x0;
  }
  else {
    local_49 = *puVar1;
    *cursor = puVar1 + 1;
    sVar2 = sVar2 - 1;
  }
  *max = sVar2;
  sVar2 = varint_length_from_bytes(&local_49);
  __n_00 = sVar2 - 1;
  __n = *max;
  puVar1 = *cursor;
  sVar2 = __n - __n_00;
  local_40 = max;
  if (__n < __n_00) {
    memcpy(local_48,puVar1,__n);
    sVar2 = 0;
    memset(local_48 + __n,0,__n_00 - __n);
    *cursor = (uchar *)0x0;
  }
  else {
    memcpy(local_48,puVar1,__n_00);
    *cursor = puVar1 + __n_00;
  }
  *local_40 = sVar2;
  varint_from_bytes(&local_49,&local_38);
  return local_38;
}

Assistant:

uint64_t pull_varint(const unsigned char **cursor, size_t *max)
{
    unsigned char buf[sizeof(uint8_t) + sizeof(uint64_t)];
    uint64_t v;

    /* FIXME: Would be more efficient to opencode varint here! */
    pull_bytes(buf, 1, cursor, max);
    pull_bytes(buf + 1, varint_length_from_bytes(buf) - 1, cursor, max);
    varint_from_bytes(buf, &v);

    return v;
}